

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::resp_appendix::serialize(resp_appendix *this)

{
  element_type *src_buf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  size_t buf_len;
  ptr<buffer> *result;
  size_t in_stack_000000e8;
  uint8_t in_stack_ffffffffffffffbf;
  buffer_serializer *in_stack_ffffffffffffffc0;
  buffer_serializer local_38;
  undefined1 local_19;
  undefined8 local_18;
  
  local_18 = 2;
  local_19 = 0;
  buffer::alloc(in_stack_000000e8);
  src_buf = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_RDI);
  buffer_serializer::buffer_serializer(&local_38,src_buf,LITTLE);
  buffer_serializer::put_u8(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  buffer_serializer::put_u8(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> serialize() const {
        const static uint8_t CUR_VERSION = 0;
        size_t buf_len = sizeof(CUR_VERSION) + sizeof(extra_order_);

        //  << Format >>
        // Format version       1 byte
        // Extra order          1 byte

        ptr<buffer> result = buffer::alloc(buf_len);
        buffer_serializer bs(*result);
        bs.put_u8(CUR_VERSION);
        bs.put_u8(extra_order_);

        return result;
    }